

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O2

void __thiscall
P2Pt::pose_poly<double>::get_r_t_from_rhos
          (pose_poly<double> *this,uint ts_len,double (*sigmas1) [8],uint *sigmas1_len,
          double (*sigmas2) [8],double *rhos1,double *rhos2,double *gama1,double *tgt1,double *gama2
          ,double *tgt2,double *Gama1,double *Tgt1,double *Gama2,double *Tgt2,
          double (*output) [64] [4] [3],uint *output_len)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  uint uVar22;
  undefined1 *puVar23;
  undefined1 *puVar24;
  ulong uVar25;
  double (*padVar26) [8];
  double (*padVar27) [8];
  ulong uVar28;
  uint j;
  uint i;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double dVar67;
  undefined1 auVar68 [16];
  double dVar71;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  double dVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  double inv_A [3] [3];
  double A [3] [3];
  double lambdas2 [8] [8];
  double lambdas1 [8] [8];
  undefined1 *local_560;
  undefined1 *local_558;
  double (*local_548) [8];
  double (*local_540) [8];
  double local_528;
  double local_520;
  double local_518;
  double local_510;
  double local_508;
  double local_500;
  double local_4f8;
  double local_4f0;
  double local_4e8;
  double local_4d8 [10];
  double local_488;
  double local_480;
  double local_478;
  double local_470;
  double local_468;
  double local_460;
  double local_458;
  double local_450;
  double local_448;
  undefined1 local_438 [512];
  undefined1 local_238 [520];
  undefined1 auVar74 [32];
  undefined1 auVar79 [32];
  
  local_488 = *Gama1 - *Gama2;
  auVar20 = vsubpd_avx(*(undefined1 (*) [16])(Gama1 + 1),*(undefined1 (*) [16])(Gama2 + 1));
  puVar23 = local_238;
  puVar24 = local_438;
  padVar26 = sigmas2;
  padVar27 = sigmas1;
  for (uVar25 = 0; uVar25 != ts_len; uVar25 = uVar25 + 1) {
    dVar1 = rhos1[uVar25];
    auVar58._8_8_ = dVar1;
    auVar58._0_8_ = dVar1;
    auVar5 = *(undefined1 (*) [16])gama2;
    dVar2 = rhos2[uVar25];
    auVar68._0_8_ = auVar5._0_8_ * dVar2;
    auVar68._8_8_ = auVar5._8_8_ * dVar2;
    dVar3 = gama1[2];
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar3;
    dVar4 = gama2[2];
    auVar68 = vfmsub231pd_fma(auVar68,*(undefined1 (*) [16])gama1,auVar58);
    auVar76._8_8_ = 0;
    auVar76._0_8_ = dVar4 * dVar2;
    auVar58 = vfmsub231sd_fma(auVar76,auVar61,auVar58);
    uVar22 = sigmas1_len[uVar25];
    dVar75 = auVar58._0_8_;
    auVar29 = vpermt2pd_avx512f(_DAT_00113260,ZEXT1632(*(undefined1 (*) [16])gama1));
    auVar21 = vpermpd_avx2(ZEXT1632(auVar68),0x14);
    auVar58 = vshufpd_avx(auVar5,auVar68,1);
    auVar30._16_16_ = auVar58;
    auVar30._0_16_ = auVar20;
    auVar30 = vpermt2pd_avx512f(_DAT_00113280,auVar30);
    auVar5 = vshufpd_avx(auVar68,auVar5,1);
    for (uVar28 = 0; uVar22 != uVar28; uVar28 = uVar28 + 1) {
      dVar67 = (*padVar27)[uVar28];
      auVar72._8_8_ = dVar67;
      auVar72._0_8_ = dVar67;
      auVar74._16_8_ = dVar67;
      auVar74._0_16_ = auVar72;
      auVar74._24_8_ = dVar67;
      auVar74 = vblendpd_avx(ZEXT1632(*(undefined1 (*) [16])tgt1),auVar74,0xc);
      dVar67 = auVar74._16_8_ * auVar29._16_8_ * auVar21._16_8_ +
               auVar74._24_8_ * auVar29._24_8_ * auVar21._24_8_;
      dVar71 = auVar74._0_8_ * auVar29._0_8_ * auVar21._0_8_ +
               auVar74._8_8_ * auVar29._8_8_ * auVar21._8_8_;
      auVar77._0_8_ = auVar20._0_8_ * Tgt1[1];
      auVar77._8_8_ = auVar20._8_8_ * Tgt1[2];
      auVar80._8_8_ = 0;
      auVar80._0_8_ = *Tgt1;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_488;
      auVar61 = vfmadd132sd_fma(auVar80,auVar77,auVar36);
      auVar58 = vshufpd_avx(auVar77,auVar77,1);
      auVar69._0_8_ = dVar67 + dVar71;
      auVar69._8_8_ = dVar67 + dVar71;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = tgt1[2];
      auVar54._8_8_ = 0;
      auVar54._0_8_ = dVar75 * dVar1;
      auVar76 = vfmadd231sd_fma(auVar69,auVar54,auVar6);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = dVar75 * dVar3;
      auVar76 = vfmadd231sd_fma(auVar76,auVar72,auVar59);
      *(double *)(puVar23 + uVar28 * 8) = (auVar61._0_8_ + auVar58._0_8_) / auVar76._0_8_;
      auVar70._0_8_ = auVar20._0_8_ * Tgt2[1];
      auVar70._8_8_ = auVar20._8_8_ * Tgt2[2];
      dVar67 = (*padVar26)[uVar28];
      auVar78._8_8_ = dVar67;
      auVar78._0_8_ = dVar67;
      auVar79._16_8_ = dVar67;
      auVar79._0_16_ = auVar78;
      auVar79._24_8_ = dVar67;
      auVar74 = vblendpd_avx(ZEXT1632(*(undefined1 (*) [16])tgt2),auVar79,0xc);
      dVar67 = auVar74._16_8_ * auVar30._16_8_ * auVar5._0_8_ +
               auVar74._24_8_ * auVar30._24_8_ * auVar5._8_8_;
      dVar71 = auVar74._0_8_ * auVar30._0_8_ * auVar68._0_8_ +
               auVar74._8_8_ * auVar30._8_8_ * auVar68._8_8_;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *Tgt2;
      auVar61 = vfmadd231sd_fma(auVar70,auVar36,auVar7);
      auVar58 = vshufpd_avx(auVar70,auVar70,1);
      auVar73._0_8_ = dVar67 + dVar71;
      auVar73._8_8_ = dVar67 + dVar71;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = tgt2[2];
      auVar62._8_8_ = 0;
      auVar62._0_8_ = dVar2 * dVar75;
      auVar76 = vfmadd231sd_fma(auVar73,auVar62,auVar8);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = dVar4 * dVar75;
      auVar76 = vfmadd231sd_fma(auVar76,auVar78,auVar66);
      *(double *)(puVar24 + uVar28 * 8) = (auVar61._0_8_ + auVar58._0_8_) / auVar76._0_8_;
    }
    padVar27 = padVar27 + 1;
    padVar26 = padVar26 + 1;
    puVar23 = puVar23 + 0x40;
    puVar24 = puVar24 + 0x40;
  }
  local_480 = *Tgt1;
  local_478 = *Tgt2;
  local_470 = (double)vmovlpd_avx(auVar20);
  local_468 = Tgt1[1];
  local_460 = Tgt2[1];
  local_458 = (double)vmovhpd_avx(auVar20);
  local_450 = Tgt1[2];
  local_448 = Tgt2[2];
  invm3x3<double>((double (*) [3] [3])&local_488,(double (*) [3] [3])local_4d8);
  *output_len = 0;
  uVar22 = 0;
  local_558 = local_238;
  local_560 = local_438;
  local_548 = sigmas1;
  local_540 = sigmas2;
  for (uVar25 = 0; uVar25 != ts_len; uVar25 = uVar25 + 1) {
    for (uVar28 = 0; uVar28 < sigmas1_len[uVar25]; uVar28 = uVar28 + 1) {
      auVar31._8_8_ = 0;
      auVar31._0_8_ = rhos1[uVar25];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *gama1;
      dVar1 = rhos2[uVar25];
      auVar41._8_8_ = 0;
      auVar41._0_8_ = dVar1;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *gama2;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *gama2 * dVar1;
      auVar20 = vfmsub231sd_fma(auVar55,auVar37,auVar31);
      local_528 = auVar20._0_8_;
      local_4f0 = *(double *)(local_558 + uVar28 * 8);
      dVar2 = (*local_548)[uVar28];
      auVar60._8_8_ = 0;
      auVar60._0_8_ = dVar2;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = rhos1[uVar25] * *tgt1;
      auVar20 = vfmadd231sd_fma(auVar56,auVar60,auVar37);
      local_520 = auVar20._0_8_ * local_4f0;
      local_4e8 = *(double *)(local_560 + uVar28 * 8);
      dVar3 = (*local_540)[uVar28];
      auVar63._8_8_ = 0;
      auVar63._0_8_ = dVar3;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = dVar1 * *tgt2;
      auVar20 = vfmadd231sd_fma(auVar57,auVar63,auVar45);
      local_518 = auVar20._0_8_ * local_4e8;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = gama1[1];
      auVar64._8_8_ = 0;
      auVar64._0_8_ = gama2[1] * dVar1;
      auVar20 = vfmsub231sd_fma(auVar64,auVar46,auVar31);
      local_510 = auVar20._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = tgt1[1];
      auVar47._8_8_ = 0;
      auVar47._0_8_ = gama1[1] * dVar2;
      auVar20 = vfmadd231sd_fma(auVar47,auVar31,auVar20);
      local_508 = auVar20._0_8_ * local_4f0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = tgt2[1];
      auVar48._8_8_ = 0;
      auVar48._0_8_ = gama2[1] * dVar3;
      auVar20 = vfmadd231sd_fma(auVar48,auVar41,auVar5);
      local_500 = auVar20._0_8_ * local_4e8;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = gama1[2];
      auVar65._8_8_ = 0;
      auVar65._0_8_ = gama2[2] * dVar1;
      auVar20 = vfmsub231sd_fma(auVar65,auVar49,auVar31);
      local_4f8 = auVar20._0_8_;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = tgt1[2];
      auVar50._8_8_ = 0;
      auVar50._0_8_ = gama1[2] * dVar2;
      auVar20 = vfmadd231sd_fma(auVar50,auVar31,auVar9);
      local_4f0 = auVar20._0_8_ * local_4f0;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = tgt2[2];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = gama2[2] * dVar3;
      auVar20 = vfmadd231sd_fma(auVar32,auVar41,auVar10);
      local_4e8 = auVar20._0_8_ * local_4e8;
      multm3x3<double>((double (*) [3] [3])&local_528,(double (*) [3] [3])local_4d8,
                       (*output)[uVar22]);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *gama1;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = Gama1[1];
      auVar51._8_8_ = 0;
      auVar51._0_8_ = Gama1[2];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = (*output)[uVar22][0][1];
      auVar38._8_8_ = 0;
      auVar38._0_8_ = *Gama1 * (*output)[uVar22][0][0];
      auVar20 = vfmadd231sd_fma(auVar38,auVar42,auVar11);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (*output)[uVar22][0][2];
      auVar20 = vfmadd231sd_fma(auVar20,auVar51,auVar12);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = rhos1[uVar25];
      auVar20 = vfmsub231sd_fma(auVar20,auVar33,auVar13);
      (*output)[uVar22][3][0] = auVar20._0_8_;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = gama1[1];
      auVar43._8_8_ = 0;
      auVar43._0_8_ = Gama1[1];
      auVar52._8_8_ = 0;
      auVar52._0_8_ = Gama1[2];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = (*output)[uVar22][1][1];
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *Gama1 * (*output)[uVar22][1][0];
      auVar20 = vfmadd231sd_fma(auVar39,auVar43,auVar14);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = (*output)[uVar22][1][2];
      auVar20 = vfmadd231sd_fma(auVar20,auVar52,auVar15);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = rhos1[uVar25];
      auVar20 = vfmsub231sd_fma(auVar20,auVar34,auVar16);
      (*output)[uVar22][3][1] = auVar20._0_8_;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = gama1[2];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = Gama1[1];
      auVar53._8_8_ = 0;
      auVar53._0_8_ = Gama1[2];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = (*output)[uVar22][2][1];
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *Gama1 * (*output)[uVar22][2][0];
      auVar20 = vfmadd231sd_fma(auVar40,auVar44,auVar17);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = (*output)[uVar22][2][2];
      auVar20 = vfmadd231sd_fma(auVar20,auVar53,auVar18);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = rhos1[uVar25];
      auVar20 = vfmsub231sd_fma(auVar20,auVar35,auVar19);
      (*output)[uVar22][3][2] = auVar20._0_8_;
      uVar22 = *output_len + 1;
      *output_len = uVar22;
    }
    local_548 = local_548 + 1;
    local_540 = local_540 + 1;
    local_558 = local_558 + 0x40;
    local_560 = local_560 + 0x40;
  }
  return;
}

Assistant:

void pose_poly<T>::
get_r_t_from_rhos(
	const unsigned ts_len,
	const T sigmas1[TS_MAX_LEN][TS_MAX_LEN], const unsigned sigmas1_len[TS_MAX_LEN],
	const T sigmas2[TS_MAX_LEN][TS_MAX_LEN],
	const T rhos1[ROOT_IDS_LEN], const T rhos2[ROOT_IDS_LEN],
	const T gama1[3], const T tgt1[3],
	const T gama2[3], const T tgt2[3],
	const T Gama1[3], const T Tgt1[3],
	const T Gama2[3], const T Tgt2[3],
	T (*output)[RT_MAX_LEN][4][3], unsigned *output_len
)
{
	T lambdas1[TS_MAX_LEN][TS_MAX_LEN]; T lambdas2[TS_MAX_LEN][TS_MAX_LEN];
	const T DGama[3] = {Gama1[0]-Gama2[0], Gama1[1]-Gama2[1], Gama1[2]-Gama2[2]};
  
	for (unsigned i = 0; i < ts_len; i++) {
    const T dgamas_rhos[3] = {
     rhos1[i]*gama1[0] - rhos2[i]*gama2[0],
     rhos1[i]*gama1[1] - rhos2[i]*gama2[1],
     rhos1[i]*gama1[2] - rhos2[i]*gama2[2]};
		for (unsigned j = 0; j < sigmas1_len[i]; j++) {
			lambdas1[i][j] = 
        (DGama[0]*Tgt1[0]+DGama[1]*Tgt1[1] + DGama[2]*Tgt1[2]) / 
        (dgamas_rhos[0]*(rhos1[i]*tgt1[0] + sigmas1[i][j]*gama1[0]) + 
        dgamas_rhos[1]*(rhos1[i]*tgt1[1] + sigmas1[i][j]*gama1[1]) +
        dgamas_rhos[2]*(rhos1[i]*tgt1[2] + sigmas1[i][j]*gama1[2]));
			lambdas2[i][j] = 
        (DGama[0]*Tgt2[0]+DGama[1]*Tgt2[1] + DGama[2]*Tgt2[2]) /
        (dgamas_rhos[0]*(rhos2[i]*tgt2[0] + sigmas2[i][j]*gama2[0]) + 
        dgamas_rhos[1]*(rhos2[i]*tgt2[1] + sigmas2[i][j]*gama2[1]) +
        dgamas_rhos[2]*(rhos2[i]*tgt2[2] + sigmas2[i][j]*gama2[2]));
		}
	}

	//% Rotation:
	const T A[3][3] = {
		DGama[0], Tgt1[0], Tgt2[0],
		DGama[1], Tgt1[1], Tgt2[1],
		DGama[2], Tgt1[2], Tgt2[2]};
	T inv_A[3][3]; invm3x3(A, inv_A);

	// Matrix containing Rotations and Translations
	T (&RT)[RT_MAX_LEN][4][3] = *output;
	unsigned &RT_len               = *output_len; RT_len = 0;
	for (unsigned i = 0; i < ts_len; i++) {
		for (unsigned j = 0; j < sigmas1_len[i]; j++, RT_len++) {
			T (&Rots)[4][3] = RT[RT_len]; T (&Transls)[3] = RT[RT_len][3];

			#define B_row(r) \
				rhos1[i]*gama1[(r)] - rhos2[i]*gama2[(r)], \
				lambdas1[i][j]*(rhos1[i]*tgt1[(r)] + sigmas1[i][j]*gama1[(r)]), \
				lambdas2[i][j]*(rhos2[i]*tgt2[(r)] + sigmas2[i][j]*gama2[(r)])

			const T B[3][3] = { B_row(0), B_row(1), B_row(2) };
			multm3x3(B, inv_A, Rots);
      Transls[0] = rhos1[i]*gama1[0] - Rots[0][0] * Gama1[0] - Rots[0][1] * Gama1[1] - Rots[0][2] * Gama1[2];
      Transls[1] = rhos1[i]*gama1[1] - Rots[1][0] * Gama1[0] - Rots[1][1] * Gama1[1] - Rots[1][2] * Gama1[2];
      Transls[2] = rhos1[i]*gama1[2] - Rots[2][0] * Gama1[0] - Rots[2][1] * Gama1[1] - Rots[2][2] * Gama1[2];
		}
	}
}